

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O1

bool duckdb::ColumnCountResult::UnsetComment(ColumnCountResult *result,idx_t buffer_pos)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  
  bVar2 = AddRow(result,buffer_pos);
  bVar1 = result->cur_line_starts_as_comment;
  pvVar3 = vector<duckdb::ColumnCount,_true>::operator[]
                     (&result->column_counts,result->result_position - 1);
  if (bVar1 == true) {
    pvVar3->is_comment = true;
  }
  else {
    pvVar3->is_mid_comment = true;
  }
  (result->super_ScannerResult).comment = false;
  result->cur_line_starts_as_comment = false;
  return bVar2;
}

Assistant:

bool ColumnCountResult::UnsetComment(ColumnCountResult &result, idx_t buffer_pos) {
	// If we are unsetting a comment, it means this row started with a comment char.
	// We add the row but tag it as a comment
	bool done = result.AddRow(result, buffer_pos);
	if (result.cur_line_starts_as_comment) {
		result.column_counts[result.result_position - 1].is_comment = true;
	} else {
		result.column_counts[result.result_position - 1].is_mid_comment = true;
	}
	result.comment = false;
	result.cur_line_starts_as_comment = false;
	return done;
}